

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlabKosorajo.c
# Opt level: O3

int checkerBig1(void)

{
  int iVar1;
  undefined8 in_RAX;
  FILE *__stream;
  char *pcVar2;
  uint uVar3;
  char *__s;
  int job;
  int check_cnt;
  undefined8 local_28;
  
  local_28 = in_RAX;
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar3 = 0xffffffff;
  }
  else {
    ScanInt((FILE *)__stream,(int *)((long)&local_28 + 4));
    if (local_28._4_4_ == 2000) {
      uVar3 = 0x7d1;
      do {
        pcVar2 = ScanInt((FILE *)__stream,(int *)&local_28);
        __s = "FAILED";
        if (pcVar2 == "FAILED") break;
        uVar3 = uVar3 - 1;
        if (uVar3 != (uint)local_28) {
          printf("wrong output -- ");
          break;
        }
        __s = pcVar2;
      } while (1 < uVar3);
    }
    else {
      printf("wrong output -- ");
      __s = "FAILED";
    }
    if (__s == "PASSED") {
      iVar1 = HaveGarbageAtTheEnd((FILE *)__stream);
      if (iVar1 == 0) {
        __s = "PASSED";
      }
      else {
        __s = "FAILED";
      }
    }
    fclose(__stream);
    puts(__s);
    uVar3 = (uint)(__s == "FAILED");
  }
  testN = testN + 1;
  return uVar3;
}

Assistant:

static int checkerBig1(void)
{
    FILE *const out = fopen("out.txt", "r");

    const char *fact = Pass;

    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }

    { // test order
        int N = N_MAX, check_cnt;
        fact = ScanInt(out, &check_cnt);

        if (check_cnt != N)
        {
            printf("wrong output -- ");
            fact = Fail;
        }
        else
        {
            for (int i = N; i > 0; i--) {

                int job;
                fact = ScanInt(out, &job);

                if (fact == Fail)
                    break;

                if (job != i) {
                    printf("wrong output -- ");
                    fact = Fail;
                    break;
                }
            }
        }
    }

    if (fact == Pass && HaveGarbageAtTheEnd(out))
        fact = Fail;

    fclose(out);
    
    printf("%s\n", fact);

    testN++;

    return fact == Fail;
}